

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawCreateInfoUtil.cpp
# Opt level: O3

void __thiscall
vkt::Draw::RenderPassCreateInfo::RenderPassCreateInfo
          (RenderPassCreateInfo *this,
          vector<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
          *attachments,
          vector<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_> *subpasses,
          vector<vk::VkSubpassDependency,_std::allocator<vk::VkSubpassDependency>_> *dependiences)

{
  pointer pSVar1;
  allocator_type local_3e;
  allocator_type local_3d;
  allocator_type local_3c;
  allocator_type local_3b;
  allocator_type local_3a;
  allocator_type local_39 [9];
  
  std::vector<vkt::Draw::AttachmentDescription,std::allocator<vkt::Draw::AttachmentDescription>>::
  vector<__gnu_cxx::__normal_iterator<vk::VkAttachmentDescription_const*,std::vector<vk::VkAttachmentDescription,std::allocator<vk::VkAttachmentDescription>>>,void>
            ((vector<vkt::Draw::AttachmentDescription,std::allocator<vkt::Draw::AttachmentDescription>>
              *)&this->m_attachments,
             (attachments->
             super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
             )._M_impl.super__Vector_impl_data._M_start,
             (attachments->
             super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
             )._M_impl.super__Vector_impl_data._M_finish,local_39);
  std::vector<vkt::Draw::SubpassDescription,std::allocator<vkt::Draw::SubpassDescription>>::
  vector<__gnu_cxx::__normal_iterator<vk::VkSubpassDescription_const*,std::vector<vk::VkSubpassDescription,std::allocator<vk::VkSubpassDescription>>>,void>
            ((vector<vkt::Draw::SubpassDescription,std::allocator<vkt::Draw::SubpassDescription>> *)
             &this->m_subpasses,
             (subpasses->
             super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>
             )._M_impl.super__Vector_impl_data._M_start,
             (subpasses->
             super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>
             )._M_impl.super__Vector_impl_data._M_finish,&local_3a);
  std::vector<vkt::Draw::SubpassDependency,std::allocator<vkt::Draw::SubpassDependency>>::
  vector<__gnu_cxx::__normal_iterator<vk::VkSubpassDependency_const*,std::vector<vk::VkSubpassDependency,std::allocator<vk::VkSubpassDependency>>>,void>
            ((vector<vkt::Draw::SubpassDependency,std::allocator<vkt::Draw::SubpassDependency>> *)
             &this->m_dependiences,
             (dependiences->
             super__Vector_base<vk::VkSubpassDependency,_std::allocator<vk::VkSubpassDependency>_>).
             _M_impl.super__Vector_impl_data._M_start,
             (dependiences->
             super__Vector_base<vk::VkSubpassDependency,_std::allocator<vk::VkSubpassDependency>_>).
             _M_impl.super__Vector_impl_data._M_finish,&local_3b);
  std::vector<vk::VkAttachmentDescription,std::allocator<vk::VkAttachmentDescription>>::
  vector<__gnu_cxx::__normal_iterator<vkt::Draw::AttachmentDescription*,std::vector<vkt::Draw::AttachmentDescription,std::allocator<vkt::Draw::AttachmentDescription>>>,void>
            ((vector<vk::VkAttachmentDescription,std::allocator<vk::VkAttachmentDescription>> *)
             &this->m_attachmentsStructs,
             (this->m_attachments).
             super__Vector_base<vkt::Draw::AttachmentDescription,_std::allocator<vkt::Draw::AttachmentDescription>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->m_attachments).
             super__Vector_base<vkt::Draw::AttachmentDescription,_std::allocator<vkt::Draw::AttachmentDescription>_>
             ._M_impl.super__Vector_impl_data._M_finish,&local_3c);
  std::vector<vk::VkSubpassDescription,std::allocator<vk::VkSubpassDescription>>::
  vector<__gnu_cxx::__normal_iterator<vkt::Draw::SubpassDescription*,std::vector<vkt::Draw::SubpassDescription,std::allocator<vkt::Draw::SubpassDescription>>>,void>
            ((vector<vk::VkSubpassDescription,std::allocator<vk::VkSubpassDescription>> *)
             &this->m_subpassesStructs,
             (this->m_subpasses).
             super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->m_subpasses).
             super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>
             ._M_impl.super__Vector_impl_data._M_finish,&local_3d);
  std::vector<vk::VkSubpassDependency,std::allocator<vk::VkSubpassDependency>>::
  vector<__gnu_cxx::__normal_iterator<vkt::Draw::SubpassDependency*,std::vector<vkt::Draw::SubpassDependency,std::allocator<vkt::Draw::SubpassDependency>>>,void>
            ((vector<vk::VkSubpassDependency,std::allocator<vk::VkSubpassDependency>> *)
             &this->m_dependiencesStructs,
             (this->m_dependiences).
             super__Vector_base<vkt::Draw::SubpassDependency,_std::allocator<vkt::Draw::SubpassDependency>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->m_dependiences).
             super__Vector_base<vkt::Draw::SubpassDependency,_std::allocator<vkt::Draw::SubpassDependency>_>
             ._M_impl.super__Vector_impl_data._M_finish,&local_3e);
  (this->super_VkRenderPassCreateInfo).sType = VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO;
  (this->super_VkRenderPassCreateInfo).pNext = (void *)0x0;
  (this->super_VkRenderPassCreateInfo).flags = 0;
  pSVar1 = (this->m_subpasses).
           super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->super_VkRenderPassCreateInfo).attachmentCount =
       (int)((ulong)((long)(this->m_attachments).
                           super__Vector_base<vkt::Draw::AttachmentDescription,_std::allocator<vkt::Draw::AttachmentDescription>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->m_attachments).
                          super__Vector_base<vkt::Draw::AttachmentDescription,_std::allocator<vkt::Draw::AttachmentDescription>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 2) * 0x38e38e39;
  (this->super_VkRenderPassCreateInfo).pAttachments =
       (this->m_attachmentsStructs).
       super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->super_VkRenderPassCreateInfo).subpassCount =
       (int)((ulong)((long)pSVar1 -
                    (long)(this->m_subpasses).
                          super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x45d1745d;
  (this->super_VkRenderPassCreateInfo).pSubpasses =
       (this->m_subpassesStructs).
       super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->super_VkRenderPassCreateInfo).dependencyCount =
       (int)((ulong)((long)(this->m_dependiences).
                           super__Vector_base<vkt::Draw::SubpassDependency,_std::allocator<vkt::Draw::SubpassDependency>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->m_dependiences).
                          super__Vector_base<vkt::Draw::SubpassDependency,_std::allocator<vkt::Draw::SubpassDependency>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x49249249;
  (this->super_VkRenderPassCreateInfo).pDependencies =
       (this->m_dependiencesStructs).
       super__Vector_base<vk::VkSubpassDependency,_std::allocator<vk::VkSubpassDependency>_>._M_impl
       .super__Vector_impl_data._M_start;
  return;
}

Assistant:

RenderPassCreateInfo::RenderPassCreateInfo (const std::vector<vk::VkAttachmentDescription>&	attachments,
											const std::vector<vk::VkSubpassDescription>&	subpasses,
											const std::vector<vk::VkSubpassDependency>&		dependiences)

	: m_attachments			(attachments.begin(), attachments.end())
	, m_subpasses			(subpasses.begin(), subpasses.end())
	, m_dependiences		(dependiences.begin(), dependiences.end())
	, m_attachmentsStructs	(m_attachments.begin(), m_attachments.end())
	, m_subpassesStructs	(m_subpasses.begin(), m_subpasses.end())
	, m_dependiencesStructs	(m_dependiences.begin(), m_dependiences.end())
{
	sType = vk::VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO;
	pNext = DE_NULL;
	flags = 0;

	attachmentCount = static_cast<deUint32>(m_attachments.size());
	pAttachments	= &m_attachmentsStructs[0];
	subpassCount	= static_cast<deUint32>(m_subpasses.size());
	pSubpasses		= &m_subpassesStructs[0];
	dependencyCount = static_cast<deUint32>(m_dependiences.size());
	pDependencies	= &m_dependiencesStructs[0];
}